

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *ilimit_w;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  U32 UVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  U32 *pUVar12;
  undefined8 uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  BYTE *pBVar22;
  uint uVar23;
  ulong *puVar24;
  ulong *puVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  BYTE *pBVar30;
  long lVar31;
  ulong uVar32;
  BYTE *pBVar33;
  U32 UVar34;
  ulong *puVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  ulong *puVar39;
  seqDef *psVar40;
  U32 UVar41;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  uint local_154;
  ulong local_148;
  ulong local_f8;
  ulong *local_d8;
  int local_7c;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar10 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  iStart = pBVar10 + uVar6;
  local_154 = *rep;
  uVar37 = rep[1];
  puVar35 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar4 <= puVar35) {
LAB_00130b89:
    *rep = local_154;
    rep[1] = uVar37;
    return (long)iEnd - (long)src;
  }
  pBVar11 = (ms->window).dictBase;
  uVar7 = (ms->window).lowLimit;
  puVar25 = (ulong *)(pBVar11 + uVar6);
  iVar15 = uVar6 - 1;
  puVar1 = (ulong *)((long)iEnd - 7);
  puVar2 = (ulong *)((long)iEnd - 3);
  puVar3 = (ulong *)((long)iEnd - 1);
  ilimit_w = iEnd + -4;
LAB_0012f3c9:
  UVar34 = (U32)puVar35;
  local_7c = UVar34 - (int)pBVar10;
  uVar16 = (local_7c - local_154) + 1;
  pBVar33 = pBVar10;
  if (uVar16 < uVar6) {
    pBVar33 = pBVar11;
  }
  if ((uVar7 < uVar16 && 2 < iVar15 - uVar16) &&
     (*(int *)((long)puVar35 + 1U) == *(int *)(pBVar33 + uVar16))) {
    puVar24 = iEnd;
    if (uVar16 < uVar6) {
      puVar24 = puVar25;
    }
    sVar18 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar35 + 5),(BYTE *)((long)(pBVar33 + uVar16) + 4),
                        (BYTE *)iEnd,(BYTE *)puVar24,iStart);
    local_f8 = sVar18 + 4;
  }
  else {
    local_f8 = 0;
  }
  uVar16 = (ms->cParams).minMatch;
  if (uVar16 - 6 < 2) {
    uVar16 = (ms->cParams).chainLog;
    uVar28 = 1 << ((byte)uVar16 & 0x1f);
    pUVar12 = ms->chainTable;
    pBVar33 = (ms->window).base;
    uVar26 = UVar34 - (int)pBVar33;
    uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar23 = (ms->window).lowLimit;
    uVar27 = uVar26 - uVar17;
    if (uVar26 - uVar23 <= uVar17) {
      uVar27 = uVar23;
    }
    pBVar22 = (ms->window).dictBase;
    uVar17 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      uVar27 = uVar23;
    }
    uVar23 = uVar26 - uVar28;
    if (uVar26 < uVar28) {
      uVar23 = 0;
    }
    uVar8 = (ms->cParams).searchLog;
    uVar16 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar16,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar34);
    if (uVar27 < uVar16) {
      iVar36 = 1 << ((byte)uVar8 & 0x1f);
      local_148 = 999999999;
      uVar32 = 3;
      do {
        uVar19 = (ulong)uVar16;
        if (uVar16 < uVar17) {
          if (pBVar22 + uVar17 < pBVar22 + uVar19 + 4) {
LAB_00130bb3:
            __assert_fail("match+4 <= dictEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x40dd,
                          "size_t ZSTD_HcFindBestMatch_generic(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          if (*(int *)(pBVar22 + uVar19) == (int)*puVar35) {
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar35 + 4),pBVar22 + uVar19 + 4,(BYTE *)iEnd,
                                pBVar22 + uVar17,pBVar33 + uVar17);
            uVar19 = sVar18 + 4;
LAB_0012f6ef:
            if ((uVar32 < uVar19) &&
               (local_148 = (ulong)((uVar26 + 2) - uVar16), uVar32 = uVar19,
               (ulong *)((long)puVar35 + uVar19) == iEnd)) goto LAB_0012fce7;
          }
        }
        else {
          puVar24 = (ulong *)(pBVar33 + uVar19);
          if (*(BYTE *)(uVar32 + (long)puVar24) == *(BYTE *)((long)puVar35 + uVar32)) {
            puVar21 = puVar35;
            if (puVar35 < puVar1) {
              if (*puVar24 == *puVar35) {
                lVar31 = 0;
                do {
                  puVar21 = (ulong *)((long)puVar35 + lVar31 + 8);
                  if (puVar1 <= puVar21) {
                    puVar24 = (ulong *)(pBVar33 + lVar31 + uVar19 + 8);
                    goto LAB_0012f6a7;
                  }
                  lVar14 = lVar31 + uVar19 + 8;
                  lVar31 = lVar31 + 8;
                } while (*(ulong *)(pBVar33 + lVar14) == *puVar21);
                uVar20 = *puVar21 ^ *(ulong *)(pBVar33 + lVar14);
                uVar19 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar31;
              }
              else {
                uVar20 = *puVar35 ^ *puVar24;
                uVar19 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = uVar19 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0012f6a7:
              if ((puVar21 < puVar2) && ((int)*puVar24 == (int)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar21 < puVar3) && ((short)*puVar24 == (short)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar21 < iEnd) {
                puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar21));
              }
              uVar19 = (long)puVar21 - (long)puVar35;
            }
            goto LAB_0012f6ef;
          }
        }
        uVar19 = uVar32;
        if ((uVar16 <= uVar23) ||
           ((uVar16 = pUVar12[uVar16 & uVar28 - 1], uVar16 <= uVar27 ||
            (iVar36 = iVar36 + -1, uVar32 = uVar19, iVar36 == 0)))) goto LAB_0012fce7;
      } while( true );
    }
LAB_0012fcb7:
    uVar19 = 3;
    local_148 = 999999999;
  }
  else {
    if (uVar16 != 5) {
      uVar16 = (ms->cParams).chainLog;
      uVar28 = 1 << ((byte)uVar16 & 0x1f);
      pUVar12 = ms->chainTable;
      pBVar33 = (ms->window).base;
      uVar26 = UVar34 - (int)pBVar33;
      uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar23 = (ms->window).lowLimit;
      uVar27 = uVar26 - uVar17;
      if (uVar26 - uVar23 <= uVar17) {
        uVar27 = uVar23;
      }
      pBVar22 = (ms->window).dictBase;
      uVar17 = (ms->window).dictLimit;
      if (ms->loadedDictEnd != 0) {
        uVar27 = uVar23;
      }
      uVar23 = uVar26 - uVar28;
      if (uVar26 < uVar28) {
        uVar23 = 0;
      }
      uVar8 = (ms->cParams).searchLog;
      uVar16 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)uVar16,
                          (BYTE *)(ulong)(ms->cParams).hashLog,UVar34);
      if (uVar27 < uVar16) {
        iVar36 = 1 << ((byte)uVar8 & 0x1f);
        local_148 = 999999999;
        uVar32 = 3;
        do {
          uVar19 = (ulong)uVar16;
          if (uVar16 < uVar17) {
            if (pBVar22 + uVar17 < pBVar22 + uVar19 + 4) goto LAB_00130bb3;
            if (*(int *)(pBVar22 + uVar19) == (int)*puVar35) {
              sVar18 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar35 + 4),pBVar22 + uVar19 + 4,(BYTE *)iEnd,
                                  pBVar22 + uVar17,pBVar33 + uVar17);
              uVar19 = sVar18 + 4;
LAB_0012fc79:
              if ((uVar32 < uVar19) &&
                 (local_148 = (ulong)((uVar26 + 2) - uVar16), uVar32 = uVar19,
                 (ulong *)((long)puVar35 + uVar19) == iEnd)) goto LAB_0012fce7;
            }
          }
          else {
            puVar24 = (ulong *)(pBVar33 + uVar19);
            if (*(BYTE *)(uVar32 + (long)puVar24) == *(BYTE *)((long)puVar35 + uVar32)) {
              puVar21 = puVar35;
              if (puVar35 < puVar1) {
                if (*puVar24 == *puVar35) {
                  lVar31 = 0;
                  do {
                    puVar21 = (ulong *)((long)puVar35 + lVar31 + 8);
                    if (puVar1 <= puVar21) {
                      puVar24 = (ulong *)(pBVar33 + lVar31 + uVar19 + 8);
                      goto LAB_0012fc31;
                    }
                    lVar14 = lVar31 + uVar19 + 8;
                    lVar31 = lVar31 + 8;
                  } while (*(ulong *)(pBVar33 + lVar14) == *puVar21);
                  uVar20 = *puVar21 ^ *(ulong *)(pBVar33 + lVar14);
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar31;
                }
                else {
                  uVar20 = *puVar35 ^ *puVar24;
                  uVar19 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  uVar19 = uVar19 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0012fc31:
                if ((puVar21 < puVar2) && ((int)*puVar24 == (int)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 4);
                  puVar24 = (ulong *)((long)puVar24 + 4);
                }
                if ((puVar21 < puVar3) && ((short)*puVar24 == (short)*puVar21)) {
                  puVar21 = (ulong *)((long)puVar21 + 2);
                  puVar24 = (ulong *)((long)puVar24 + 2);
                }
                if (puVar21 < iEnd) {
                  puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar21));
                }
                uVar19 = (long)puVar21 - (long)puVar35;
              }
              goto LAB_0012fc79;
            }
          }
          uVar19 = uVar32;
          if ((uVar16 <= uVar23) ||
             ((uVar16 = pUVar12[uVar16 & uVar28 - 1], uVar16 <= uVar27 ||
              (iVar36 = iVar36 + -1, uVar32 = uVar19, iVar36 == 0)))) goto LAB_0012fce7;
        } while( true );
      }
      goto LAB_0012fcb7;
    }
    uVar16 = (ms->cParams).chainLog;
    uVar27 = 1 << ((byte)uVar16 & 0x1f);
    pUVar12 = ms->chainTable;
    pBVar33 = (ms->window).base;
    uVar17 = UVar34 - (int)pBVar33;
    uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar9 = (ms->window).lowLimit;
    UVar41 = uVar17 - uVar23;
    if (uVar17 - UVar9 <= uVar23) {
      UVar41 = UVar9;
    }
    pBVar22 = (ms->window).dictBase;
    uVar23 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      UVar41 = UVar9;
    }
    uVar26 = uVar17 - uVar27;
    if (uVar17 < uVar27) {
      uVar26 = 0;
    }
    uVar28 = (ms->cParams).searchLog;
    uVar16 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar16,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar34);
    if (UVar41 < uVar16) {
      iVar36 = 1 << ((byte)uVar28 & 0x1f);
      local_148 = 999999999;
      uVar32 = 3;
      do {
        uVar19 = (ulong)uVar16;
        if (uVar16 < uVar23) {
          if (pBVar22 + uVar23 < pBVar22 + uVar19 + 4) goto LAB_00130bb3;
          if (*(int *)(pBVar22 + uVar19) == (int)*puVar35) {
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar35 + 4),pBVar22 + uVar19 + 4,(BYTE *)iEnd,
                                pBVar22 + uVar23,pBVar33 + uVar23);
            uVar19 = sVar18 + 4;
LAB_0012f9c6:
            if ((uVar32 < uVar19) &&
               (local_148 = (ulong)((uVar17 + 2) - uVar16), uVar32 = uVar19,
               (ulong *)((long)puVar35 + uVar19) == iEnd)) goto LAB_0012fce7;
          }
        }
        else {
          puVar24 = (ulong *)(pBVar33 + uVar19);
          if (*(BYTE *)(uVar32 + (long)puVar24) == *(BYTE *)((long)puVar35 + uVar32)) {
            puVar21 = puVar35;
            if (puVar35 < puVar1) {
              if (*puVar24 == *puVar35) {
                lVar31 = 0;
                do {
                  puVar21 = (ulong *)((long)puVar35 + lVar31 + 8);
                  if (puVar1 <= puVar21) {
                    puVar24 = (ulong *)(pBVar33 + lVar31 + uVar19 + 8);
                    goto LAB_0012f97e;
                  }
                  lVar14 = lVar31 + uVar19 + 8;
                  lVar31 = lVar31 + 8;
                } while (*(ulong *)(pBVar33 + lVar14) == *puVar21);
                uVar20 = *puVar21 ^ *(ulong *)(pBVar33 + lVar14);
                uVar19 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = (uVar19 >> 3 & 0x1fffffff) + lVar31;
              }
              else {
                uVar20 = *puVar35 ^ *puVar24;
                uVar19 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar19 = uVar19 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_0012f97e:
              if ((puVar21 < puVar2) && ((int)*puVar24 == (int)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 4);
                puVar24 = (ulong *)((long)puVar24 + 4);
              }
              if ((puVar21 < puVar3) && ((short)*puVar24 == (short)*puVar21)) {
                puVar21 = (ulong *)((long)puVar21 + 2);
                puVar24 = (ulong *)((long)puVar24 + 2);
              }
              if (puVar21 < iEnd) {
                puVar21 = (ulong *)((long)puVar21 + (ulong)((BYTE)*puVar24 == (BYTE)*puVar21));
              }
              uVar19 = (long)puVar21 - (long)puVar35;
            }
            goto LAB_0012f9c6;
          }
        }
        uVar19 = uVar32;
        if ((uVar16 <= uVar26) ||
           ((uVar16 = pUVar12[uVar16 & uVar27 - 1], uVar16 <= UVar41 ||
            (iVar36 = iVar36 + -1, uVar32 = uVar19, iVar36 == 0)))) goto LAB_0012fce7;
      } while( true );
    }
    uVar19 = 3;
    local_148 = 999999999;
  }
LAB_0012fce7:
  uVar32 = local_f8;
  if (local_f8 < uVar19) {
    uVar32 = uVar19;
  }
  if (3 < uVar32) {
    puVar24 = puVar35;
    if (uVar19 <= local_f8) {
      local_148 = 0;
      puVar24 = (ulong *)((long)puVar35 + 1U);
    }
    pBVar33 = (BYTE *)((long)puVar35 + 9);
LAB_0012fd5d:
    local_d8 = puVar24;
    uVar19 = uVar32;
    uVar20 = local_148;
    if (puVar35 < puVar4) {
      puVar24 = (ulong *)((long)puVar35 + 1);
      local_7c = local_7c + 1;
      if (uVar20 == 0) {
        uVar20 = 0;
      }
      else {
        uVar16 = local_7c - local_154;
        pBVar22 = pBVar10;
        if (uVar16 < uVar6) {
          pBVar22 = pBVar11;
        }
        if ((uVar7 < uVar16 && 2 < iVar15 - uVar16) &&
           (*(int *)puVar24 == *(int *)(pBVar22 + uVar16))) {
          puVar21 = iEnd;
          if (uVar16 < uVar6) {
            puVar21 = puVar25;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar35 + 5),(BYTE *)((long)(pBVar22 + uVar16) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar21,iStart);
          uVar16 = (int)uVar20 + 1;
          if (uVar16 == 0) goto LAB_00130bd2;
          if (sVar18 < 0xfffffffffffffffc) {
            uVar23 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            if ((int)((uVar23 ^ 0x1f) + (int)uVar19 * 3 + -0x1e) < (int)(sVar18 + 4) * 3) {
              uVar20 = 0;
              local_d8 = puVar24;
              uVar19 = sVar18 + 4;
            }
          }
        }
      }
      uVar16 = (ms->cParams).minMatch;
      UVar34 = (U32)puVar24;
      if (uVar16 - 6 < 2) {
        uVar16 = (ms->cParams).chainLog;
        uVar26 = 1 << ((byte)uVar16 & 0x1f);
        pUVar12 = ms->chainTable;
        pBVar22 = (ms->window).base;
        uVar28 = UVar34 - (int)pBVar22;
        uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar23 = (ms->window).lowLimit;
        uVar27 = uVar28 - uVar17;
        if (uVar28 - uVar23 <= uVar17) {
          uVar27 = uVar23;
        }
        pBVar30 = (ms->window).dictBase;
        uVar17 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar27 = uVar23;
        }
        uVar23 = uVar28 - uVar26;
        if (uVar28 < uVar26) {
          uVar23 = 0;
        }
        uVar8 = (ms->cParams).searchLog;
        uVar16 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar16,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar34);
        if (uVar27 < uVar16) {
          iVar36 = 1 << ((byte)uVar8 & 0x1f);
          local_148 = 999999999;
          uVar32 = 3;
          do {
            uVar38 = (ulong)uVar16;
            if (uVar16 < uVar17) {
              if (pBVar30 + uVar17 < pBVar30 + uVar38 + 4) goto LAB_00130bb3;
              if (*(int *)(pBVar30 + uVar38) == *(int *)puVar24) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar35 + 5),pBVar30 + uVar38 + 4,(BYTE *)iEnd,
                                    pBVar30 + uVar17,pBVar22 + uVar17);
                uVar38 = sVar18 + 4;
LAB_001300fd:
                if ((uVar32 < uVar38) &&
                   (local_148 = (ulong)((uVar28 + 2) - uVar16), uVar32 = uVar38,
                   (ulong *)((long)puVar24 + uVar38) == iEnd)) goto LAB_001306ba;
              }
            }
            else {
              puVar21 = (ulong *)(pBVar22 + uVar38);
              if (*(BYTE *)(uVar32 + (long)puVar21) == *(BYTE *)((long)puVar24 + uVar32)) {
                puVar39 = puVar24;
                if (puVar24 < puVar1) {
                  if (*puVar21 == *puVar24) {
                    lVar31 = 0;
                    do {
                      puVar39 = (ulong *)(pBVar33 + lVar31);
                      if (puVar1 <= puVar39) {
                        puVar21 = (ulong *)(pBVar22 + lVar31 + uVar38 + 8);
                        goto LAB_001300af;
                      }
                      lVar14 = lVar31 + uVar38 + 8;
                      lVar31 = lVar31 + 8;
                    } while (*(ulong *)(pBVar22 + lVar14) == *puVar39);
                    uVar29 = *puVar39 ^ *(ulong *)(pBVar22 + lVar14);
                    uVar38 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar31;
                  }
                  else {
                    uVar29 = *puVar24 ^ *puVar21;
                    uVar38 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = uVar38 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_001300af:
                  if ((puVar39 < puVar2) && ((int)*puVar21 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar21 = (ulong *)((long)puVar21 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar21 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar21 = (ulong *)((long)puVar21 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar39));
                  }
                  uVar38 = (long)puVar39 - (long)puVar24;
                }
                goto LAB_001300fd;
              }
            }
            if ((uVar16 <= uVar23) ||
               ((uVar16 = pUVar12[uVar16 & uVar26 - 1], uVar16 <= uVar27 ||
                (iVar36 = iVar36 + -1, iVar36 == 0)))) goto LAB_001306ba;
          } while( true );
        }
      }
      else if (uVar16 == 5) {
        uVar16 = (ms->cParams).chainLog;
        uVar28 = 1 << ((byte)uVar16 & 0x1f);
        pUVar12 = ms->chainTable;
        pBVar22 = (ms->window).base;
        uVar26 = UVar34 - (int)pBVar22;
        uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar23 = (ms->window).lowLimit;
        uVar27 = uVar26 - uVar17;
        if (uVar26 - uVar23 <= uVar17) {
          uVar27 = uVar23;
        }
        pBVar30 = (ms->window).dictBase;
        uVar17 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          uVar27 = uVar23;
        }
        uVar23 = uVar26 - uVar28;
        if (uVar26 < uVar28) {
          uVar23 = 0;
        }
        uVar8 = (ms->cParams).searchLog;
        uVar16 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar16,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar34);
        if (uVar27 < uVar16) {
          iVar36 = 1 << ((byte)uVar8 & 0x1f);
          local_148 = 999999999;
          uVar32 = 3;
          do {
            uVar38 = (ulong)uVar16;
            if (uVar16 < uVar17) {
              if (pBVar30 + uVar17 < pBVar30 + uVar38 + 4) goto LAB_00130bb3;
              if (*(int *)(pBVar30 + uVar38) == *(int *)puVar24) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar35 + 5),pBVar30 + uVar38 + 4,(BYTE *)iEnd,
                                    pBVar30 + uVar17,pBVar22 + uVar17);
                uVar38 = sVar18 + 4;
LAB_001303c9:
                if ((uVar32 < uVar38) &&
                   (local_148 = (ulong)((uVar26 + 2) - uVar16), uVar32 = uVar38,
                   (ulong *)((long)puVar24 + uVar38) == iEnd)) goto LAB_001306ba;
              }
            }
            else {
              puVar21 = (ulong *)(pBVar22 + uVar38);
              if (*(BYTE *)(uVar32 + (long)puVar21) == *(BYTE *)((long)puVar24 + uVar32)) {
                puVar39 = puVar24;
                if (puVar24 < puVar1) {
                  if (*puVar21 == *puVar24) {
                    lVar31 = 0;
                    do {
                      if (puVar1 <= pBVar33 + lVar31) {
                        puVar21 = (ulong *)(pBVar22 + lVar31 + uVar38 + 8);
                        puVar39 = (ulong *)(pBVar33 + lVar31);
                        goto LAB_0013037b;
                      }
                      lVar14 = lVar31 + uVar38 + 8;
                      uVar29 = *(ulong *)((long)puVar35 + lVar31 + 9);
                      lVar31 = lVar31 + 8;
                    } while (*(ulong *)(pBVar22 + lVar14) == uVar29);
                    uVar29 = uVar29 ^ *(ulong *)(pBVar22 + lVar14);
                    uVar38 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar31;
                  }
                  else {
                    uVar29 = *puVar24 ^ *puVar21;
                    uVar38 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                      }
                    }
                    uVar38 = uVar38 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0013037b:
                  if ((puVar39 < puVar2) && ((int)*puVar21 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar21 = (ulong *)((long)puVar21 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar21 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar21 = (ulong *)((long)puVar21 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar39));
                  }
                  uVar38 = (long)puVar39 - (long)puVar24;
                }
                goto LAB_001303c9;
              }
            }
            if ((uVar16 <= uVar23) ||
               ((uVar16 = pUVar12[uVar16 & uVar28 - 1], uVar16 <= uVar27 ||
                (iVar36 = iVar36 + -1, iVar36 == 0)))) goto LAB_001306ba;
          } while( true );
        }
      }
      else {
        uVar16 = (ms->cParams).chainLog;
        uVar27 = 1 << ((byte)uVar16 & 0x1f);
        pUVar12 = ms->chainTable;
        pBVar22 = (ms->window).base;
        uVar17 = UVar34 - (int)pBVar22;
        uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar9 = (ms->window).lowLimit;
        UVar41 = uVar17 - uVar23;
        if (uVar17 - UVar9 <= uVar23) {
          UVar41 = UVar9;
        }
        pBVar30 = (ms->window).dictBase;
        uVar23 = (ms->window).dictLimit;
        if (ms->loadedDictEnd != 0) {
          UVar41 = UVar9;
        }
        uVar26 = uVar17 - uVar27;
        if (uVar17 < uVar27) {
          uVar26 = 0;
        }
        uVar28 = (ms->cParams).searchLog;
        uVar16 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar16,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar34);
        if (UVar41 < uVar16) {
          iVar36 = 1 << ((byte)uVar28 & 0x1f);
          local_148 = 999999999;
          uVar38 = 3;
          do {
            uVar32 = (ulong)uVar16;
            if (uVar16 < uVar23) {
              if (pBVar30 + uVar23 < pBVar30 + uVar32 + 4) goto LAB_00130bb3;
              if (*(int *)(pBVar30 + uVar32) == *(int *)puVar24) {
                sVar18 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar35 + 5),pBVar30 + uVar32 + 4,(BYTE *)iEnd,
                                    pBVar30 + uVar23,pBVar22 + uVar23);
                uVar32 = sVar18 + 4;
LAB_00130678:
                if ((uVar38 < uVar32) &&
                   (local_148 = (ulong)((uVar17 + 2) - uVar16), uVar38 = uVar32,
                   (ulong *)((long)puVar24 + uVar32) == iEnd)) goto LAB_001306ba;
              }
            }
            else {
              puVar21 = (ulong *)(pBVar22 + uVar32);
              if (*(BYTE *)(uVar38 + (long)puVar21) == *(BYTE *)((long)puVar24 + uVar38)) {
                puVar39 = puVar24;
                if (puVar24 < puVar1) {
                  if (*puVar21 == *puVar24) {
                    lVar31 = 0;
                    do {
                      puVar39 = (ulong *)(pBVar33 + lVar31);
                      if (puVar1 <= puVar39) {
                        puVar21 = (ulong *)(pBVar22 + lVar31 + uVar32 + 8);
                        goto LAB_0013062a;
                      }
                      lVar14 = lVar31 + uVar32 + 8;
                      lVar31 = lVar31 + 8;
                    } while (*(ulong *)(pBVar22 + lVar14) == *puVar39);
                    uVar29 = *puVar39 ^ *(ulong *)(pBVar22 + lVar14);
                    uVar32 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = (uVar32 >> 3 & 0x1fffffff) + lVar31;
                  }
                  else {
                    uVar29 = *puVar24 ^ *puVar21;
                    uVar32 = 0;
                    if (uVar29 != 0) {
                      for (; (uVar29 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    uVar32 = uVar32 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0013062a:
                  if ((puVar39 < puVar2) && ((int)*puVar21 == (int)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 4);
                    puVar21 = (ulong *)((long)puVar21 + 4);
                  }
                  if ((puVar39 < puVar3) && ((short)*puVar21 == (short)*puVar39)) {
                    puVar39 = (ulong *)((long)puVar39 + 2);
                    puVar21 = (ulong *)((long)puVar21 + 2);
                  }
                  if (puVar39 < iEnd) {
                    puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar39));
                  }
                  uVar32 = (long)puVar39 - (long)puVar24;
                }
                goto LAB_00130678;
              }
            }
            uVar32 = uVar38;
            if ((uVar16 <= uVar26) ||
               ((uVar16 = pUVar12[uVar16 & uVar27 - 1], uVar16 <= UVar41 ||
                (iVar36 = iVar36 + -1, uVar38 = uVar32, iVar36 == 0)))) goto LAB_001306ba;
          } while( true );
        }
      }
      if (uVar20 == 0xffffffff) goto LAB_00130bd2;
    }
    goto LAB_0013075d;
  }
  puVar35 = (ulong *)((long)puVar35 + ((long)puVar35 - (long)src >> 8) + 1);
  goto LAB_00130b0e;
LAB_001306ba:
  uVar16 = (int)local_148 + 1;
  if ((uVar16 == 0) || (uVar23 = (int)uVar20 + 1, uVar23 == 0)) {
LAB_00130bd2:
    __assert_fail("val != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x12c2,"U32 ZSTD_highbit32(U32)");
  }
  if (uVar32 < 4) goto LAB_0013075d;
  iVar36 = 0x1f;
  if (uVar16 != 0) {
    for (; uVar16 >> iVar36 == 0; iVar36 = iVar36 + -1) {
    }
  }
  uVar16 = 0x1f;
  if (uVar23 != 0) {
    for (; uVar23 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  pBVar33 = pBVar33 + 1;
  puVar35 = puVar24;
  if ((int)uVar32 * 4 - iVar36 <= (int)((uVar16 ^ 0x1f) + (int)uVar19 * 4 + -0x1b))
  goto LAB_0013075d;
  goto LAB_0012fd5d;
LAB_0013075d:
  if (uVar20 == 0) {
    UVar34 = 1;
  }
  else {
    pBVar30 = (BYTE *)((long)local_d8 + (2 - (long)(pBVar10 + uVar20)));
    pBVar22 = iStart;
    pBVar33 = pBVar10;
    if ((uint)pBVar30 < uVar6) {
      pBVar22 = pBVar11 + uVar7;
      pBVar33 = pBVar11;
    }
    if ((src < local_d8) && (uVar32 = (ulong)pBVar30 & 0xffffffff, pBVar22 < pBVar33 + uVar32)) {
      pBVar33 = pBVar33 + uVar32;
      do {
        puVar35 = (ulong *)((long)local_d8 + -1);
        pBVar33 = pBVar33 + -1;
        if ((*(BYTE *)puVar35 != *pBVar33) ||
           (uVar19 = uVar19 + 1, local_d8 = puVar35, puVar35 <= src)) break;
      } while (pBVar22 < pBVar33);
    }
    UVar34 = (int)uVar20 + 1;
    uVar37 = local_154;
    local_154 = (int)uVar20 - 2;
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00130c10:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2038,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00130bf1:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203a,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar32 = (long)local_d8 - (long)src;
  puVar35 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar35 + uVar32)) {
LAB_00130c2f:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (iEnd < local_d8) {
LAB_00130c4e:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x203c,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (ilimit_w < local_d8) {
    ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)src,(BYTE *)local_d8,(BYTE *)ilimit_w);
  }
  else {
    uVar20 = *(ulong *)((long)src + 8);
    *puVar35 = *src;
    puVar35[1] = uVar20;
    pBVar33 = seqStore->lit;
    if (uVar32 < 0x11) {
      seqStore->lit = pBVar33 + uVar32;
      goto LAB_0013093f;
    }
    lVar31 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
    if (lVar31 < 8) {
      if (-0x10 < lVar31) {
        __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x1268,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
    }
    else if (0xffffffffffffffe0 < lVar31 - 0x10U) {
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1270,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    uVar20 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar33 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar33 + 0x18) = uVar20;
    if (0x20 < (long)uVar32) {
      lVar31 = 0;
      do {
        puVar5 = (undefined8 *)((long)src + lVar31 + 0x20);
        uVar13 = puVar5[1];
        pBVar22 = pBVar33 + lVar31 + 0x20;
        *(undefined8 *)pBVar22 = *puVar5;
        *(undefined8 *)(pBVar22 + 8) = uVar13;
        puVar5 = (undefined8 *)((long)src + lVar31 + 0x30);
        uVar13 = puVar5[1];
        *(undefined8 *)(pBVar22 + 0x10) = *puVar5;
        *(undefined8 *)(pBVar22 + 0x18) = uVar13;
        lVar31 = lVar31 + 0x20;
      } while (pBVar22 + 0x20 < pBVar33 + uVar32);
    }
  }
  seqStore->lit = seqStore->lit + uVar32;
  if (0xffff < uVar32) {
    if (seqStore->longLengthID != 0) {
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x204d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0013093f:
  psVar40 = seqStore->sequences;
  psVar40->litLength = (U16)uVar32;
  psVar40->offset = UVar34;
  if (0xffff < uVar19 - 3) {
    if (seqStore->longLengthID != 0) {
LAB_00130c6d:
      __assert_fail("seqStorePtr->longLengthID == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2058,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar40->matchLength = (U16)(uVar19 - 3);
  psVar40 = psVar40 + 1;
  seqStore->sequences = psVar40;
  uVar16 = uVar37;
  for (src = (void *)((long)local_d8 + uVar19); uVar37 = uVar16, puVar35 = (ulong *)src,
      src <= puVar4; src = (void *)((long)src + sVar18 + 4)) {
    uVar16 = (uint)((long)src - (long)(pBVar10 + uVar37));
    pBVar33 = pBVar10;
    if (uVar16 < uVar6) {
      pBVar33 = pBVar11;
    }
    if (((uVar16 <= uVar7) || (iVar15 - uVar16 < 3)) ||
       ((int)*src != *(int *)(pBVar33 + ((long)src - (long)(pBVar10 + uVar37) & 0xffffffff))))
    break;
    puVar35 = iEnd;
    if (uVar16 < uVar6) {
      puVar35 = puVar25;
    }
    sVar18 = ZSTD_count_2segments
                       ((BYTE *)((long)src + 4),
                        (BYTE *)((long)(pBVar33 +
                                       ((long)src - (long)(pBVar10 + uVar37) & 0xffffffff)) + 4),
                        (BYTE *)iEnd,(BYTE *)puVar35,iStart);
    if (seqStore->maxNbSeq <= (ulong)((long)psVar40 - (long)seqStore->sequencesStart >> 3))
    goto LAB_00130c10;
    if (0x20000 < seqStore->maxNbLit) goto LAB_00130bf1;
    puVar35 = (ulong *)seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < puVar35) goto LAB_00130c2f;
    if (iEnd < src) goto LAB_00130c4e;
    if (ilimit_w < src) {
      ZSTD_safecopyLiterals((BYTE *)puVar35,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
    }
    else {
      uVar32 = *(ulong *)((long)src + 8);
      *puVar35 = *src;
      puVar35[1] = uVar32;
    }
    psVar40 = seqStore->sequences;
    psVar40->litLength = 0;
    psVar40->offset = 1;
    if (0xffff < sVar18 + 1) {
      if (seqStore->longLengthID != 0) goto LAB_00130c6d;
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar40->matchLength = (U16)(sVar18 + 1);
    psVar40 = psVar40 + 1;
    seqStore->sequences = psVar40;
    uVar16 = local_154;
    local_154 = uVar37;
  }
LAB_00130b0e:
  if (puVar4 <= puVar35) goto LAB_00130b89;
  goto LAB_0012f3c9;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}